

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_type_info.hpp
# Opt level: O3

shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_true> __thiscall
duckdb::EnumTypeInfoTemplated<unsigned_char>::Deserialize
          (EnumTypeInfoTemplated<unsigned_char> *this,Deserializer *deserializer,uint32_t size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_true> sVar1;
  anon_class_16_2_81344e6c func;
  string_t *strings;
  Vector values_insert_order;
  undefined1 local_bd;
  uint32_t local_bc;
  EnumTypeInfoTemplated<unsigned_char> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  string_t *local_a8;
  LogicalType local_a0;
  Vector local_88;
  
  local_bc = size;
  LogicalType::LogicalType(&local_a0,VARCHAR);
  Vector::Vector(&local_88,&local_a0,(ulong)size);
  LogicalType::~LogicalType(&local_a0);
  local_a8 = (string_t *)local_88.data;
  func.values_insert_order = &local_88;
  func.strings = &local_a8;
  Deserializer::
  ReadList<duckdb::EnumTypeInfoTemplated<unsigned_char>::Deserialize(duckdb::Deserializer&,unsigned_int)::_lambda(duckdb::Deserializer::List&,unsigned_long)_1_>
            (deserializer,0xc9,"values",func);
  local_b8 = (EnumTypeInfoTemplated<unsigned_char> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::EnumTypeInfoTemplated<unsigned_char>,std::allocator<duckdb::EnumTypeInfoTemplated<unsigned_char>>,duckdb::Vector&,unsigned_int&>
            (&local_b0,&local_b8,
             (allocator<duckdb::EnumTypeInfoTemplated<unsigned_char>_> *)&local_bd,&local_88,
             &local_bc);
  (this->super_EnumTypeInfo).super_ExtraTypeInfo._vptr_ExtraTypeInfo = (_func_int **)local_b8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_EnumTypeInfo).super_ExtraTypeInfo.type = local_b0._M_pi;
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_b0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_01401579;
    }
    else {
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
LAB_01401579:
  if (local_88.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_88.type);
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.internal.
  super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_true>)
         sVar1.internal.
         super___shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static shared_ptr<EnumTypeInfoTemplated> Deserialize(Deserializer &deserializer, uint32_t size) {
		Vector values_insert_order(LogicalType::VARCHAR, size);
		auto strings = FlatVector::GetData<string_t>(values_insert_order);

		deserializer.ReadList(201, "values", [&](Deserializer::List &list, idx_t i) {
			strings[i] = StringVector::AddStringOrBlob(values_insert_order, list.ReadElement<string>());
		});
		return make_shared_ptr<EnumTypeInfoTemplated>(values_insert_order, size);
	}